

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_22c7f6c::PeerManagerImpl::PrepareBlockFilterRequest
          (PeerManagerImpl *this,CNode *node,Peer *peer,BlockFilterType filter_type,
          uint32_t start_height,uint256 *stop_hash,uint32_t max_height_diff,CBlockIndex **stop_index
          ,BlockFilterIndex **filter_index)

{
  ulong uVar1;
  uint32_t uVar2;
  CBlockIndex **ppCVar3;
  BlockFilterIndex **ppBVar4;
  NodeId NVar5;
  bool bVar6;
  CBlockIndex *pindex;
  BlockFilterIndex *pBVar7;
  string *args;
  undefined7 in_register_00000009;
  Level level;
  int source_line;
  uint uVar9;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  char *fmt;
  uint32_t *args_1;
  unique_lock<std::recursive_mutex> *this_00;
  uint local_78;
  BlockFilterType filter_type_00;
  uint32_t start_height_local;
  uint32_t stop_height;
  string local_58;
  long local_38;
  uint256 *puVar8;
  
  uVar2 = max_height_diff;
  args_1 = &local_78;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  start_height_local = start_height;
  if (((int)CONCAT71(in_register_00000009,filter_type) != 0) ||
     ((peer->m_our_services & NODE_COMPACT_FILTERS) == NODE_NONE)) {
    bVar6 = ::LogAcceptCategory(NET,(Level)node);
    if (bVar6) {
      local_58._M_dataplus._M_p = (pointer)node->id;
      stop_height = CONCAT31(stop_height._1_3_,filter_type);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x62;
      logging_function._M_str = "PrepareBlockFilterRequest";
      logging_function._M_len = 0x19;
      LogPrintFormatInternal<long,unsigned_char>
                (logging_function,source_file,0xd7e,NET,Debug,(ConstevalFormatString<2U>)0xc9c792,
                 (long *)&local_58,(uchar *)&stop_height);
    }
    goto LAB_0074040b;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&stop_height,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
             ,0xd84,false);
  puVar8 = stop_hash;
  pindex = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,stop_hash);
  ppCVar3 = stop_index;
  level = (Level)puVar8;
  *stop_index = pindex;
  if (pindex == (CBlockIndex *)0x0) {
LAB_00740415:
    bVar6 = ::LogAcceptCategory(NET,level);
    if (bVar6) {
      _local_78 = node->id;
      base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)stop_hash);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file_00._M_len = 0x62;
      logging_function_00._M_str = "PrepareBlockFilterRequest";
      logging_function_00._M_len = 0x19;
      LogPrintFormatInternal<long,std::__cxx11::string>
                (logging_function_00,source_file_00,0xd8a,NET,Debug,
                 (ConstevalFormatString<2U>)0xc9c7c7,(long *)&local_78,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    LOCK();
    (node->fDisconnect)._M_base._M_i = true;
    UNLOCK();
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stop_height);
  }
  else {
    bVar6 = BlockRequestAllowed(this,pindex);
    level = (Level)pindex;
    if (!bVar6) goto LAB_00740415;
    this_00 = (unique_lock<std::recursive_mutex> *)&stop_height;
    std::unique_lock<std::recursive_mutex>::~unique_lock(this_00);
    NVar5 = _local_78;
    ppBVar4 = filter_index;
    stop_height = (*ppCVar3)->nHeight;
    uVar9 = stop_height - start_height;
    if (stop_height < start_height) {
      bVar6 = ::LogAcceptCategory(NET,level);
      if (bVar6) {
        local_58._M_dataplus._M_p = (pointer)node->id;
        args_1 = &start_height_local;
        source_line = 0xd94;
        fmt = 
        "peer %d sent invalid getcfilters/getcfheaders with start height %d and stop height %d\n";
LAB_00740586:
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_02._M_len = 0x62;
        logging_function_02._M_str = "PrepareBlockFilterRequest";
        logging_function_02._M_len = 0x19;
        LogPrintFormatInternal<long,unsigned_int,unsigned_int>
                  (logging_function_02,source_file_02,source_line,NET,Debug,
                   (ConstevalFormatString<3U>)fmt,(long *)&local_58,args_1,(uint *)this_00);
      }
LAB_0074040b:
      LOCK();
      (node->fDisconnect)._M_base._M_i = true;
      UNLOCK();
    }
    else {
      if (uVar2 <= uVar9) {
        bVar6 = ::LogAcceptCategory(NET,level);
        if (bVar6) {
          local_58._M_dataplus._M_p = (pointer)node->id;
          uVar1 = (ulong)_local_78 >> 0x20;
          _local_78 = CONCAT44((int)uVar1,uVar9 + 1);
          this_00 = (unique_lock<std::recursive_mutex> *)&max_height_diff;
          source_line = 0xd9a;
          fmt = "peer %d requested too many cfilters/cfheaders: %d / %d\n";
          goto LAB_00740586;
        }
        goto LAB_0074040b;
      }
      filter_type_00 = (BlockFilterType)((ulong)_local_78 >> 0x38);
      pBVar7 = GetBlockFilterIndex(filter_type_00);
      _local_78 = NVar5;
      *ppBVar4 = pBVar7;
      bVar6 = true;
      if (pBVar7 != (BlockFilterIndex *)0x0) goto LAB_00740492;
      bVar6 = ::LogAcceptCategory(NET,level);
      NVar5 = _local_78;
      if (bVar6) {
        bVar6 = false;
        filter_type_00 = (BlockFilterType)((ulong)_local_78 >> 0x38);
        args = BlockFilterTypeName_abi_cxx11_(filter_type_00);
        _local_78 = NVar5;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_01._M_len = 0x62;
        logging_function_01._M_str = "PrepareBlockFilterRequest";
        logging_function_01._M_len = 0x19;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_01,source_file_01,0xda1,NET,Debug,
                   (ConstevalFormatString<1U>)0xc9c880,args);
        goto LAB_00740492;
      }
    }
  }
  bVar6 = false;
LAB_00740492:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::PrepareBlockFilterRequest(CNode& node, Peer& peer,
                                                BlockFilterType filter_type, uint32_t start_height,
                                                const uint256& stop_hash, uint32_t max_height_diff,
                                                const CBlockIndex*& stop_index,
                                                BlockFilterIndex*& filter_index)
{
    const bool supported_filter_type =
        (filter_type == BlockFilterType::BASIC &&
         (peer.m_our_services & NODE_COMPACT_FILTERS));
    if (!supported_filter_type) {
        LogDebug(BCLog::NET, "peer %d requested unsupported block filter type: %d\n",
                 node.GetId(), static_cast<uint8_t>(filter_type));
        node.fDisconnect = true;
        return false;
    }

    {
        LOCK(cs_main);
        stop_index = m_chainman.m_blockman.LookupBlockIndex(stop_hash);

        // Check that the stop block exists and the peer would be allowed to fetch it.
        if (!stop_index || !BlockRequestAllowed(stop_index)) {
            LogDebug(BCLog::NET, "peer %d requested invalid block hash: %s\n",
                     node.GetId(), stop_hash.ToString());
            node.fDisconnect = true;
            return false;
        }
    }

    uint32_t stop_height = stop_index->nHeight;
    if (start_height > stop_height) {
        LogDebug(BCLog::NET, "peer %d sent invalid getcfilters/getcfheaders with "
                 "start height %d and stop height %d\n",
                 node.GetId(), start_height, stop_height);
        node.fDisconnect = true;
        return false;
    }
    if (stop_height - start_height >= max_height_diff) {
        LogDebug(BCLog::NET, "peer %d requested too many cfilters/cfheaders: %d / %d\n",
                 node.GetId(), stop_height - start_height + 1, max_height_diff);
        node.fDisconnect = true;
        return false;
    }

    filter_index = GetBlockFilterIndex(filter_type);
    if (!filter_index) {
        LogDebug(BCLog::NET, "Filter index for supported type %s not found\n", BlockFilterTypeName(filter_type));
        return false;
    }

    return true;
}